

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_chk_m68k(CPUM68KState_conflict *env,int32_t val,int32_t ub)

{
  bool bVar1;
  CPUM68KState_conflict *__mptr;
  uintptr_t unaff_retaddr;
  
  env->cc_n = val;
  if (ub < 0) {
    bVar1 = val < 0 && ub < val;
  }
  else {
    bVar1 = (uint)ub < (uint)val;
  }
  env->cc_c = (uint)bVar1;
  if ((-1 < val) && (val <= ub)) {
    return;
  }
  cpu_restore_state_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr,true);
  env->cc_op = 1;
  env->pc = env->pc + 2;
  *(undefined4 *)(env[-3].fregs + 2) = 6;
  cpu_loop_exit_m68k((CPUState *)(env[-0x40].fregs + 2));
}

Assistant:

void HELPER(chk)(CPUM68KState *env, int32_t val, int32_t ub)
{
    /*
     * From the specs:
     *   X: Not affected, C,V,Z: Undefined,
     *   N: Set if val < 0; cleared if val > ub, undefined otherwise
     * We implement here values found from a real MC68040:
     *   X,V,Z: Not affected
     *   N: Set if val < 0; cleared if val >= 0
     *   C: if 0 <= ub: set if val < 0 or val > ub, cleared otherwise
     *      if 0 > ub: set if val > ub and val < 0, cleared otherwise
     */
    env->cc_n = val;
    env->cc_c = 0 <= ub ? val < 0 || val > ub : val > ub && val < 0;

    if (val < 0 || val > ub) {
        CPUState *cs = env_cpu(env);

        /* Recover PC and CC_OP for the beginning of the insn.  */
        cpu_restore_state(cs, GETPC(), true);

        /* flags have been modified by gen_flush_flags() */
        env->cc_op = CC_OP_FLAGS;
        /* Adjust PC to end of the insn.  */
        env->pc += 2;

        cs->exception_index = EXCP_CHK;
        cpu_loop_exit(cs);
    }
}